

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkAbcDec.c
# Opt level: O2

void Lpk_DecomposeClean(Vec_Ptr_t *vLeaves,int nLeavesOld)

{
  Lpk_Fun_t *p;
  int i;
  
  for (i = nLeavesOld; i < vLeaves->nSize; i = i + 1) {
    p = (Lpk_Fun_t *)Vec_PtrEntry(vLeaves,i);
    Lpk_FunFree(p);
  }
  Vec_PtrShrink(vLeaves,nLeavesOld);
  return;
}

Assistant:

void Lpk_DecomposeClean( Vec_Ptr_t * vLeaves, int nLeavesOld )
{
    Lpk_Fun_t * pFunc;
    int i;
    Vec_PtrForEachEntryStart( Lpk_Fun_t *, vLeaves, pFunc, i, nLeavesOld )
        Lpk_FunFree( pFunc );
    Vec_PtrShrink( vLeaves, nLeavesOld );
}